

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O0

int __thiscall
rlib::sequencer::MmlCompiler::EventControlChange::clone
          (EventControlChange *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<rlib::sequencer::MmlCompiler::EventControlChange> *in_stack_ffffffffffffffc8;
  EventControlChange *this_00;
  
  this_00 = this;
  std::
  make_shared<rlib::sequencer::MmlCompiler::EventControlChange,rlib::sequencer::MmlCompiler::EventControlChange_const&>
            (this);
  std::shared_ptr<rlib::sequencer::MmlCompiler::Event>::
  shared_ptr<rlib::sequencer::MmlCompiler::EventControlChange,void>
            ((shared_ptr<rlib::sequencer::MmlCompiler::Event> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<rlib::sequencer::MmlCompiler::EventControlChange>::~shared_ptr
            ((shared_ptr<rlib::sequencer::MmlCompiler::EventControlChange> *)0x1945b3);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventControlChange>(*this);
			}